

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_bind(uv_udp_t *handle,sockaddr *addr,uint addrlen,uint flags)

{
  int fd;
  int iVar1;
  int *piVar2;
  uint uVar3;
  int yes;
  undefined4 local_2c;
  
  if ((flags & 0xfffffffa) != 0) {
    return -0x16;
  }
  if (((flags & 1) == 0) || (iVar1 = -0x16, addr->sa_family == 10)) {
    fd = (handle->io_watcher).fd;
    if (fd == -1) {
      fd = uv__socket((uint)addr->sa_family,2,0);
      if (fd < 0) {
        return fd;
      }
      (handle->io_watcher).fd = fd;
    }
    if ((flags < 4) || (iVar1 = uv__set_reuse(fd), iVar1 == 0)) {
      if ((flags & 1) != 0) {
        local_2c = 1;
        iVar1 = setsockopt(fd,0x29,0x1a,&local_2c,4);
        if (iVar1 == -1) {
          piVar2 = __errno_location();
          return -*piVar2;
        }
      }
      iVar1 = bind(fd,(sockaddr *)addr,addrlen);
      if (iVar1 == 0) {
        uVar3 = handle->flags | 0x400000;
        if (addr->sa_family != 10) {
          uVar3 = handle->flags;
        }
        handle->flags = uVar3 | 0x2000;
        iVar1 = 0;
      }
      else {
        piVar2 = __errno_location();
        iVar1 = -0x16;
        if (*piVar2 != 0x61) {
          iVar1 = -*piVar2;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int uv__udp_bind(uv_udp_t* handle,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int yes;
  int fd;

  /* Check for bad flags. */
  if (flags & ~(UV_UDP_IPV6ONLY | UV_UDP_REUSEADDR))
    return UV_EINVAL;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_UDP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  fd = handle->io_watcher.fd;
  if (fd == -1) {
    err = uv__socket(addr->sa_family, SOCK_DGRAM, 0);
    if (err < 0)
      return err;
    fd = err;
    handle->io_watcher.fd = fd;
  }

  if (flags & UV_UDP_REUSEADDR) {
    err = uv__set_reuse(fd);
    if (err)
      return err;
  }

  if (flags & UV_UDP_IPV6ONLY) {
#ifdef IPV6_V6ONLY
    yes = 1;
    if (setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, &yes, sizeof yes) == -1) {
      err = UV__ERR(errno);
      return err;
    }
#else
    err = UV_ENOTSUP;
    return err;
#endif
  }

  if (bind(fd, addr, addrlen)) {
    err = UV__ERR(errno);
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      err = UV_EINVAL;
    return err;
  }

  if (addr->sa_family == AF_INET6)
    handle->flags |= UV_HANDLE_IPV6;

  handle->flags |= UV_HANDLE_BOUND;
  return 0;
}